

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_sizeof_int(int64_t num)

{
  int64_t num_local;
  
  if (num < 0) {
    if (num < -0x20) {
      if ((num < -0x80) || (0x7f < num)) {
        if ((num < -0x8000) || (0xffff < num)) {
          if ((num < -0x80000000) || (0xffffffff < num)) {
            num_local._4_4_ = 9;
          }
          else {
            num_local._4_4_ = 5;
          }
        }
        else {
          num_local._4_4_ = 3;
        }
      }
      else {
        num_local._4_4_ = 2;
      }
    }
    else {
      num_local._4_4_ = 1;
    }
    return num_local._4_4_;
  }
  __assert_fail("num < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x6c4,"uint32_t mp_sizeof_int(int64_t)");
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_int(int64_t num)
{
	assert(num < 0);
	if (num >= -0x20) {
		return 1;
	} else if (num >= INT8_MIN && num <= INT8_MAX) {
		return 1 + sizeof(int8_t);
	} else if (num >= INT16_MIN && num <= UINT16_MAX) {
		return 1 + sizeof(int16_t);
	} else if (num >= INT32_MIN && num <= UINT32_MAX) {
		return 1 + sizeof(int32_t);
	} else {
		return 1 + sizeof(int64_t);
	}
}